

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O1

bool __thiscall btSingleRayCallback::process(btSingleRayCallback *this,btBroadphaseProxy *proxy)

{
  float fVar1;
  RayResultCallback *pRVar2;
  btCollisionObject *pbVar3;
  int iVar4;
  btCollisionObjectWrapper local_38;
  
  pRVar2 = this->m_resultCallback;
  fVar1 = pRVar2->m_closestHitFraction;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    pbVar3 = (btCollisionObject *)proxy->m_clientObject;
    iVar4 = (*pRVar2->_vptr_RayResultCallback[2])(pRVar2,pbVar3->m_broadphaseHandle);
    if ((char)iVar4 != '\0') {
      local_38.m_shape = pbVar3->m_collisionShape;
      local_38.m_parent = (btCollisionObjectWrapper *)0x0;
      local_38.m_worldTransform = &pbVar3->m_worldTransform;
      local_38.m_partId = -1;
      local_38.m_index = -1;
      local_38.m_collisionObject = pbVar3;
      btCollisionWorld::rayTestSingleInternal
                (&this->m_rayFromTrans,&this->m_rayToTrans,&local_38,this->m_resultCallback);
    }
  }
  return (bool)(-(fVar1 != 0.0) & 1);
}

Assistant:

virtual bool	process(const btBroadphaseProxy* proxy)
	{
		///terminate further ray tests, once the closestHitFraction reached zero
		if (m_resultCallback.m_closestHitFraction == btScalar(0.f))
			return false;

		btCollisionObject*	collisionObject = (btCollisionObject*)proxy->m_clientObject;

		//only perform raycast if filterMask matches
		if(m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) 
		{
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			//btVector3 collisionObjectAabbMin,collisionObjectAabbMax;
#if 0
#ifdef RECALCULATE_AABB
			btVector3 collisionObjectAabbMin,collisionObjectAabbMax;
			collisionObject->getCollisionShape()->getAabb(collisionObject->getWorldTransform(),collisionObjectAabbMin,collisionObjectAabbMax);
#else
			//getBroadphase()->getAabb(collisionObject->getBroadphaseHandle(),collisionObjectAabbMin,collisionObjectAabbMax);
			const btVector3& collisionObjectAabbMin = collisionObject->getBroadphaseHandle()->m_aabbMin;
			const btVector3& collisionObjectAabbMax = collisionObject->getBroadphaseHandle()->m_aabbMax;
#endif
#endif
			//btScalar hitLambda = m_resultCallback.m_closestHitFraction;
			//culling already done by broadphase
			//if (btRayAabb(m_rayFromWorld,m_rayToWorld,collisionObjectAabbMin,collisionObjectAabbMax,hitLambda,m_hitNormal))
			{
				m_world->rayTestSingle(m_rayFromTrans,m_rayToTrans,
					collisionObject,
					collisionObject->getCollisionShape(),
					collisionObject->getWorldTransform(),
					m_resultCallback);
			}
		}
		return true;
	}